

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int discard_handshake_context(quicly_conn_t *conn,size_t epoch)

{
  long in_RSI;
  uint unaff_retaddr;
  quicly_conn_t *in_stack_00000008;
  int ret;
  size_t in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe0;
  int local_4;
  
  if ((in_RSI != 0) && (in_RSI != 2)) {
    __assert_fail("epoch == QUICLY_EPOCH_INITIAL || epoch == QUICLY_EPOCH_HANDSHAKE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                  ,0x59c,"int discard_handshake_context(quicly_conn_t *, size_t)");
  }
  local_4 = discard_sentmap_by_epoch(in_stack_00000008,unaff_retaddr);
  if (local_4 == 0) {
    destroy_handshake_flow
              ((quicly_conn_t *)(ulong)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    free_handshake_space((st_quicly_handshake_space_t **)0x14af2a);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int discard_handshake_context(quicly_conn_t *conn, size_t epoch)
{
    int ret;

    assert(epoch == QUICLY_EPOCH_INITIAL || epoch == QUICLY_EPOCH_HANDSHAKE);

    if ((ret = discard_sentmap_by_epoch(conn, 1u << epoch)) != 0)
        return ret;
    destroy_handshake_flow(conn, epoch);
    free_handshake_space(epoch == QUICLY_EPOCH_INITIAL ? &conn->initial : &conn->handshake);

    return 0;
}